

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::namemorestring(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  Definition *pDVar2;
  
  requireDStackDepth(this,1,"NAME>STRING");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  if ((ulong)uVar1 <
      (ulong)(((long)(this->definitions).
                     super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->definitions).
                    super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x50)) {
    pDVar2 = getDefinition(this,uVar1);
    moveIntoDataSpace(this,this->VarOffsetWordBuffer,(pDVar2->name)._M_dataplus._M_p,
                      (pDVar2->name)._M_string_length);
    ForthStack<unsigned_int>::setTop(this_00,this->VarOffsetWordBuffer);
    uVar1 = (uint)(pDVar2->name)._M_string_length;
  }
  else {
    ForthStack<unsigned_int>::setTop(this_00,this->VarOffsetWordBuffer);
    uVar1 = 0;
  }
  ForthStack<unsigned_int>::push(this_00,uVar1);
  return;
}

Assistant:

void namemorestring(){
			REQUIRE_DSTACK_DEPTH(1, "NAME>STRING");
			auto nt=dStack.getTop();
			if(nt>=0 && nt<definitions.size()){
			auto defn=getDefinition(nt);
			auto &name=defn->name;
			moveIntoDataSpace(VarOffsetWordBuffer,name.c_str(),name.size());
			dStack.setTop(VarOffsetWordBuffer);
			dStack.push(CELL(name.size()));
			} else {
				dStack.setTop(VarOffsetWordBuffer);
				dStack.push(0);
			}
		}